

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O1

void __thiscall
DAnimatedDoor::DAnimatedDoor
          (DAnimatedDoor *this,sector_t *sec,line_t_conflict *line,int speed,int delay,
          FDoorAnimation *anim)

{
  double dVar1;
  double dVar2;
  line_t_conflict *plVar3;
  sector_t_conflict *this_00;
  uint uVar4;
  FTexture *pFVar5;
  long lVar6;
  double dVar7;
  FName local_34;
  
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,(sector_t_conflict *)sec,false);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_006fc6e0;
  this->m_DoorAnim = anim;
  this->m_Line1 = line;
  this->m_Line2 = line;
  if (0 < (long)sec->linecount) {
    lVar6 = 0;
    do {
      plVar3 = sec->lines[lVar6];
      if ((plVar3 != line) &&
         (plVar3->sidedef[0]->textures[0].texture.texnum ==
          line->sidedef[0]->textures[0].texture.texnum)) {
        this->m_Line2 = plVar3;
        break;
      }
      lVar6 = lVar6 + 1;
    } while (sec->linecount != lVar6);
  }
  uVar4 = line->sidedef[0]->textures[0].texture.texnum;
  line->sidedef[0]->textures[1].texture.texnum = uVar4;
  plVar3 = this->m_Line2;
  plVar3->sidedef[0]->textures[1].texture.texnum = uVar4;
  if (uVar4 < TexMan.Textures.Count) {
    pFVar5 = TexMan.Textures.Array[(int)uVar4].Texture;
  }
  else {
    pFVar5 = (FTexture *)0x0;
  }
  if (pFVar5 == (FTexture *)0x0) {
    dVar7 = 64.0;
  }
  else {
    uVar4 = (uint)((double)((uint)pFVar5->Height * 2) / (pFVar5->Scale).Y);
    dVar7 = (double)(int)((uVar4 & 1) + ((int)uVar4 >> 1));
  }
  this_00 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  dVar1 = (this_00->ceilingplane).D;
  dVar2 = (this_00->ceilingplane).normal.Z;
  this->m_Status = 0;
  this->m_Speed = speed;
  this->m_Delay = delay;
  this->m_Timer = speed;
  this->m_Frame = 0;
  uVar4 = line->flags;
  this->m_SetBlocking1 = (bool)((byte)uVar4 & 1);
  this->m_SetBlocking2 = (bool)((byte)plVar3->flags & 1);
  line->flags = uVar4 | 1;
  *(byte *)&plVar3->flags = (byte)plVar3->flags | 1;
  this->m_BotDist = dVar1;
  sector_t::MoveCeiling((sector_t *)this_00,2048.0,dVar1 - dVar7 * dVar2,-1,1,false);
  if ((this->m_DoorAnim->OpenSound).Index != 0) {
    SN_StartSequence((sector_t *)
                     (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,4,
                     &local_34,1);
  }
  return;
}

Assistant:

DAnimatedDoor::DAnimatedDoor (sector_t *sec, line_t *line, int speed, int delay, FDoorAnimation *anim)
	: DMovingCeiling (sec, false)
{
	double topdist;
	FTextureID picnum;

	m_DoorAnim = anim;

	m_Line1 = line;
	m_Line2 = line;

	for (int i = 0; i < sec->linecount; ++i)
	{
		if (sec->lines[i] == line)
			continue;

		if (sec->lines[i]->sidedef[0]->GetTexture(side_t::top) == line->sidedef[0]->GetTexture(side_t::top))
		{
			m_Line2 = sec->lines[i];
			break;
		}
	}


	picnum = m_Line1->sidedef[0]->GetTexture(side_t::top);
	m_Line1->sidedef[0]->SetTexture(side_t::mid, picnum);
	m_Line2->sidedef[0]->SetTexture(side_t::mid, picnum);

	// don't forget texture scaling here!
	FTexture *tex = TexMan[picnum];
	topdist = tex ? tex->GetScaledHeight() : 64;

	topdist = m_Sector->ceilingplane.fD() - topdist * m_Sector->ceilingplane.fC();

	m_Status = Opening;
	m_Speed = speed;
	m_Delay = delay;
	m_Timer = m_Speed;
	m_Frame = 0;
	m_SetBlocking1 = !!(m_Line1->flags & ML_BLOCKING);
	m_SetBlocking2 = !!(m_Line2->flags & ML_BLOCKING);
	m_Line1->flags |= ML_BLOCKING;
	m_Line2->flags |= ML_BLOCKING;
	m_BotDist = m_Sector->ceilingplane.fD();
	m_Sector->MoveCeiling (2048., topdist, 1);
	if (m_DoorAnim->OpenSound != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_INTERIOR, m_DoorAnim->OpenSound, 1);
	}
}